

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O1

bool __thiscall util::fs::FileLock::wait_lock(FileLock *this,string *filename,int retries,int sleep)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_40._M_allocated_capacity = (ulong)(long)sleep / 1000;
  local_40._8_8_ = ((ulong)(long)sleep % 1000) * 1000000;
  do {
    if (retries < 1) {
      return true;
    }
    bVar1 = is_locked(this,filename);
    if (!bVar1) {
      return true;
    }
    if (0 < sleep) {
      local_50._M_p = (pointer)local_40._M_allocated_capacity;
      local_48 = local_40._8_8_;
      do {
        this = (FileLock *)&local_50;
        iVar2 = nanosleep((timespec *)&local_50,(timespec *)&local_50);
        if (iVar2 != -1) break;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
    }
    bVar1 = retries == 1;
    retries = retries + -1;
    if (bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool
FileLock::wait_lock (std::string const& filename, int retries, int sleep)
{
    while (retries > 0 && this->is_locked(filename))
    {
        system::sleep(sleep);
        retries -= 1;
        if (retries <= 0)
            return false;
    }
    return true;
}